

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_ciphersuites.c
# Opt level: O1

size_t mbedtls_ssl_ciphersuite_get_cipher_key_bitlen(mbedtls_ssl_ciphersuite_t *info)

{
  mbedtls_cipher_info_t *pmVar1;
  size_t sVar2;
  
  pmVar1 = mbedtls_cipher_info_from_type((uint)info->cipher);
  if (pmVar1 == (mbedtls_cipher_info_t *)0x0) {
    sVar2 = 0;
  }
  else {
    sVar2 = (size_t)(*(uint *)&pmVar1->field_0x8 >> 2 & 0x3c0);
  }
  return sVar2;
}

Assistant:

size_t mbedtls_ssl_ciphersuite_get_cipher_key_bitlen(const mbedtls_ssl_ciphersuite_t *info)
{
#if defined(MBEDTLS_USE_PSA_CRYPTO)
    psa_status_t status = PSA_ERROR_CORRUPTION_DETECTED;
    psa_key_type_t key_type;
    psa_algorithm_t alg;
    size_t key_bits;

    status = mbedtls_ssl_cipher_to_psa(info->cipher,
                                       info->flags & MBEDTLS_CIPHERSUITE_SHORT_TAG ? 8 : 16,
                                       &alg, &key_type, &key_bits);

    if (status != PSA_SUCCESS) {
        return 0;
    }

    return key_bits;
#else
    const mbedtls_cipher_info_t * const cipher_info =
        mbedtls_cipher_info_from_type((mbedtls_cipher_type_t) info->cipher);

    return mbedtls_cipher_info_get_key_bitlen(cipher_info);
#endif /* MBEDTLS_USE_PSA_CRYPTO */
}